

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_binary_packed_decoder.cpp
# Opt level: O0

void __thiscall
duckdb::DeltaBinaryPackedDecoder::Read
          (DeltaBinaryPackedDecoder *this,uint8_t *defines,idx_t read_count,Vector *result,
          idx_t result_offset)

{
  long *plVar1;
  DbpDecoder *this_00;
  ParquetColumnSchema *pPVar2;
  runtime_error *this_01;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ResizeableBuffer *in_RDI;
  ColumnReader *in_R8;
  Allocator *allocator;
  idx_t valid_count;
  idx_t in_stack_ffffffffffffffc0;
  idx_t in_stack_ffffffffffffffc8;
  Allocator *allocator_00;
  uint8_t *in_stack_ffffffffffffffd0;
  
  this_00 = (DbpDecoder *)
            ColumnReader::GetValidCount
                      (in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                       in_stack_ffffffffffffffc0);
  allocator_00 = *(Allocator **)(*(long *)((in_RDI->super_ByteBuffer).ptr + 0x10) + 0x118);
  ResizeableBuffer::reset(in_RDI);
  pPVar2 = ColumnReader::Schema((ColumnReader *)(in_RDI->super_ByteBuffer).ptr);
  if (pPVar2->parquet_type == INT32) {
    ResizeableBuffer::resize((ResizeableBuffer *)this_00,allocator_00,in_stack_ffffffffffffffc0);
    unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator->
              ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true> *)
               in_RDI);
    DbpDecoder::GetBatch<int>(this_00,(data_ptr_t)allocator_00,in_stack_ffffffffffffffc0);
  }
  else {
    if (pPVar2->parquet_type != INT64) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (this_01,"DELTA_BINARY_PACKED should only be INT32 or INT64");
      __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
    }
    ResizeableBuffer::resize((ResizeableBuffer *)this_00,allocator_00,in_stack_ffffffffffffffc0);
    unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true>::operator->
              ((unique_ptr<duckdb::DbpDecoder,_std::default_delete<duckdb::DbpDecoder>,_true> *)
               in_RDI);
    DbpDecoder::GetBatch<long>(this_00,(data_ptr_t)allocator_00,in_stack_ffffffffffffffc0);
  }
  plVar1 = (long *)(in_RDI->super_ByteBuffer).ptr;
  (**(code **)(*plVar1 + 0x70))(plVar1,(in_RDI->super_ByteBuffer).len,in_RSI,in_RDX,in_R8,in_RCX);
  return;
}

Assistant:

void DeltaBinaryPackedDecoder::Read(uint8_t *defines, idx_t read_count, Vector &result, idx_t result_offset) {
	idx_t valid_count = reader.GetValidCount(defines, read_count, result_offset);

	auto &allocator = reader.reader.allocator;
	decoded_data_buffer.reset();
	switch (reader.Schema().parquet_type) {
	case duckdb_parquet::Type::INT32:
		decoded_data_buffer.resize(allocator, sizeof(int32_t) * (valid_count));
		dbp_decoder->GetBatch<int32_t>(decoded_data_buffer.ptr, valid_count);
		break;
	case duckdb_parquet::Type::INT64:
		decoded_data_buffer.resize(allocator, sizeof(int64_t) * (valid_count));
		dbp_decoder->GetBatch<int64_t>(decoded_data_buffer.ptr, valid_count);
		break;

	default:
		throw std::runtime_error("DELTA_BINARY_PACKED should only be INT32 or INT64");
	}
	// Plain() will put NULLs in the right place
	reader.Plain(decoded_data_buffer, defines, read_count, result_offset, result);
}